

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<capnp::_::(anonymous_namespace)::UnionState&>
          (String *__return_storage_ptr__,kj *this,UnionState *params)

{
  char *in_RCX;
  char (*in_stack_ffffffffffffffa8) [2];
  size_t sStack_50;
  ArrayDisposer *local_48;
  String local_38;
  
  strArray<unsigned_int_const(&)[4]>
            ((String *)&stack0xffffffffffffffa8,this,(uint (*) [4])0x2cab64,in_RCX);
  str<char_const(&)[13],kj::String,char_const(&)[4],int_const&,char_const(&)[2]>
            (&local_38,(kj *)"UnionState({",(char (*) [13])&stack0xffffffffffffffa8,(String *)"}, ",
             (char (*) [4])(this + 0x10),(int *)0x2d0f4d,in_stack_ffffffffffffffa8);
  if (in_stack_ffffffffffffffa8 != (char (*) [2])0x0) {
    (*(code *)**(undefined8 **)local_48)(local_48,in_stack_ffffffffffffffa8,1,sStack_50,sStack_50,0)
    ;
  }
  (__return_storage_ptr__->content).ptr = local_38.content.ptr;
  (__return_storage_ptr__->content).size_ = local_38.content.size_;
  (__return_storage_ptr__->content).disposer = local_38.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}